

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<kj::Exception&>
               (char *file,int line,LogSeverity severity,char *macroArgs,Exception *params)

{
  ArrayPtr<kj::String> argValues_00;
  String argValues [1];
  String *local_40;
  size_t local_38;
  undefined8 *puStack_30;
  
  kj::operator*(&local_40,params);
  argValues_00.size_ = local_38;
  argValues_00.ptr = local_40;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffffa8,argValues_00);
  if (local_40 != (String *)0x0) {
    (**(code **)*puStack_30)(puStack_30,local_40,1,local_38,local_38,0);
  }
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}